

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMDetector.cpp
# Opt level: O0

bool __thiscall
ZXing::DataMatrix::EdgeTracer::traceCorner(EdgeTracer *this,PointF dir,PointF *corner)

{
  PointI p;
  PointI p_00;
  PointT<double> p_01;
  PointF p_02;
  PointT<double> p_03;
  PointT<double> p_04;
  PointT<double> pos;
  PointT<double> pos_00;
  PointT<double> pos_01;
  bool bVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  int *piVar5;
  value_t_conflict2 *pvVar6;
  undefined8 *in_RSI;
  long in_RDI;
  PointT<double> PVar7;
  int j;
  PointT<double> pEdge;
  int i;
  int step;
  int breadth;
  Matrix<signed_char> *in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffe00;
  int in_stack_fffffffffffffe04;
  double in_stack_fffffffffffffe08;
  double in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe18;
  undefined4 in_stack_fffffffffffffe1c;
  int iVar8;
  uint in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  undefined4 in_stack_fffffffffffffe30;
  uint uVar9;
  int local_1c8;
  double local_190;
  double local_188;
  PointT<double> local_160;
  double local_150;
  double local_148;
  PointT<double> local_140;
  PointT<double> local_130;
  PointT<double> local_120;
  PointT<int> local_110;
  PointT<int> local_108;
  double local_100;
  double local_f8;
  PointF local_f0;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  int local_c0;
  int local_bc;
  PointT<double> local_b8;
  double local_a8;
  double local_a0;
  PointT<double> local_98;
  PointT<double> local_88;
  PointT<double> local_78;
  PointT<double> local_68;
  uint local_54;
  int local_50;
  int local_4c;
  double local_48;
  double local_40;
  PointT<double> local_38;
  byte local_25;
  int local_24 [3];
  double local_18;
  double local_10;
  undefined4 local_4;
  
  BitMatrixCursor<ZXing::PointT<double>_>::step
            ((BitMatrixCursor<ZXing::PointT<double>_> *)
             CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             (value_t_conflict)CONCAT44(in_stack_fffffffffffffe1c,in_stack_fffffffffffffe18));
  log<double>(*(PointT<double> *)(in_RDI + 8),0);
  *in_RSI = *(undefined8 *)(in_RDI + 8);
  in_RSI[1] = *(undefined8 *)(in_RDI + 0x10);
  std::swap<ZXing::PointT<double>>((PointT<double> *)(in_RDI + 0x18),&local_160);
  PVar7 = ZXing::operator*(in_stack_fffffffffffffe04,(PointT<double> *)in_stack_fffffffffffffdf8);
  local_190 = PVar7.x;
  local_188 = PVar7.y;
  local_18 = local_190;
  local_10 = local_188;
  local_24[0] = 2;
  local_25 = 0;
  local_48 = local_190;
  local_40 = local_188;
  PVar7.y._0_4_ = in_stack_fffffffffffffe00;
  PVar7.x = (double)in_stack_fffffffffffffdf8;
  PVar7.y._4_4_ = in_stack_fffffffffffffe04;
  local_38 = mainDirection<double>(PVar7);
  local_18 = local_38.x;
  local_10 = local_38.y;
  local_4c = 1;
  while( true ) {
    if (local_24[0] == 1) {
      local_1c8 = 2;
    }
    else {
      local_1c8 = 3;
      if ((local_25 & 1) != 0) {
        local_1c8 = 1;
      }
    }
    if (local_1c8 < local_4c) break;
    for (local_50 = 1; local_50 <= local_24[0]; local_50 = local_50 + 1) {
      for (local_54 = 0; (int)local_54 <= (local_50 / 4 + 1) * 2 * local_4c; local_54 = local_54 + 1
          ) {
        lVar4 = in_RDI + 8;
        uVar9 = local_54;
        local_88 = ZXing::operator*(in_stack_fffffffffffffe04,
                                    (PointT<double> *)in_stack_fffffffffffffdf8);
        local_78 = operator+<double,_double>
                             ((PointT<double> *)
                              CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                              (PointT<double> *)in_stack_fffffffffffffdf8);
        if ((local_54 & 1) == 0) {
          iVar3 = -local_54;
        }
        else {
          iVar3 = local_54 + 1;
        }
        iVar3 = iVar3 / 2;
        local_98 = ZXing::operator*(in_stack_fffffffffffffe04,
                                    (PointT<double> *)in_stack_fffffffffffffdf8);
        local_68 = operator+<double,_double>
                             ((PointT<double> *)
                              CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                              (PointT<double> *)in_stack_fffffffffffffdf8);
        local_a8 = local_68.x;
        local_a0 = local_68.y;
        log<double>(local_68,0);
        local_b8 = operator+<double,_double>
                             ((PointT<double> *)
                              CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                              (PointT<double> *)in_stack_fffffffffffffdf8);
        pos.y._0_4_ = in_stack_fffffffffffffe30;
        pos.x = (double)lVar4;
        pos.y._4_4_ = uVar9;
        bVar1 = BitMatrixCursor<ZXing::PointT<double>_>::blackAt
                          ((BitMatrixCursor<ZXing::PointT<double>_> *)
                           CONCAT44(iVar3,in_stack_fffffffffffffe20),pos);
        if (bVar1) {
          local_bc = 0;
          goto LAB_002763e1;
        }
      }
    }
    local_4c = local_4c + 1;
  }
  local_4 = 1;
LAB_00276734:
  p_03.y = in_stack_fffffffffffffe10;
  p_03.x = in_stack_fffffffffffffe08;
  bVar2 = BitMatrixCursor<ZXing::PointT<double>_>::isIn
                    ((BitMatrixCursor<ZXing::PointT<double>_> *)
                     CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),p_03);
  bVar1 = false;
  if (bVar2) {
    p_04.y = in_stack_fffffffffffffe10;
    p_04.x = in_stack_fffffffffffffe08;
    bVar1 = BitMatrixCursor<ZXing::PointT<double>_>::isIn
                      ((BitMatrixCursor<ZXing::PointT<double>_> *)
                       (CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00) &
                       0xffffffffffffff),p_04);
  }
  return bVar1;
LAB_002763e1:
  local_c0 = 3;
  iVar8 = local_bc;
  piVar5 = std::max<int>(local_24,&local_c0);
  in_stack_fffffffffffffe20 = in_stack_fffffffffffffe20 & 0xffffff;
  if (iVar8 < *piVar5) {
    local_d0 = local_68.x;
    local_c8 = local_68.y;
    p_01.y = in_stack_fffffffffffffe10;
    p_01.x = in_stack_fffffffffffffe08;
    bVar1 = BitMatrixCursor<ZXing::PointT<double>_>::isIn
                      ((BitMatrixCursor<ZXing::PointT<double>_> *)
                       CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),p_01);
    in_stack_fffffffffffffe20 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe20);
  }
  if ((char)(in_stack_fffffffffffffe20 >> 0x18) == '\0') {
    local_4 = 2;
    goto LAB_00276734;
  }
  local_e0 = local_68.x;
  local_d8 = local_68.y;
  pos_00.y._0_4_ = in_stack_fffffffffffffe30;
  pos_00.x = (double)lVar4;
  pos_00.y._4_4_ = uVar9;
  bVar1 = BitMatrixCursor<ZXing::PointT<double>_>::whiteAt
                    ((BitMatrixCursor<ZXing::PointT<double>_> *)
                     CONCAT44(iVar3,in_stack_fffffffffffffe20),pos_00);
  if (bVar1) goto LAB_002764af;
  local_120 = operator-<double,_double>
                        ((PointT<double> *)
                         CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                         (PointT<double> *)in_stack_fffffffffffffdf8);
  local_68 = local_120;
  local_130 = operator-<double,_double>
                        ((PointT<double> *)
                         CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                         (PointT<double> *)in_stack_fffffffffffffdf8);
  pos_01.y._0_4_ = in_stack_fffffffffffffe30;
  pos_01.x = (double)lVar4;
  pos_01.y._4_4_ = uVar9;
  bVar1 = BitMatrixCursor<ZXing::PointT<double>_>::blackAt
                    ((BitMatrixCursor<ZXing::PointT<double>_> *)
                     CONCAT44(iVar3,in_stack_fffffffffffffe20),pos_01);
  if (bVar1) {
    local_140 = operator-<double,_double>
                          ((PointT<double> *)
                           CONCAT44(in_stack_fffffffffffffe04,in_stack_fffffffffffffe00),
                           (PointT<double> *)in_stack_fffffffffffffdf8);
    local_68 = local_140;
  }
  local_150 = local_68.x;
  local_148 = local_68.y;
  log<double>(local_68,0);
  local_bc = local_bc + 1;
  goto LAB_002763e1;
LAB_002764af:
  local_100 = local_68.x;
  local_f8 = local_68.y;
  p_02.y = in_stack_fffffffffffffe10;
  p_02.x = in_stack_fffffffffffffe08;
  local_f0 = centered(p_02);
  *(double *)(in_RDI + 8) = local_f0.x;
  *(double *)(in_RDI + 0x10) = local_f0.y;
  if ((*(long *)(in_RDI + 0x28) != 0) && (local_24[0] == 1)) {
    in_stack_fffffffffffffe10 = *(double *)(in_RDI + 0x28);
    PointT<int>::PointT<double>(&local_108,(PointT<double> *)(in_RDI + 8));
    p.y = in_stack_fffffffffffffe04;
    p.x = in_stack_fffffffffffffe00;
    pvVar6 = Matrix<signed_char>::get(in_stack_fffffffffffffdf8,p);
    if ((int)*pvVar6 == *(int *)(in_RDI + 0x30)) {
      local_4 = 2;
      goto LAB_00276734;
    }
    in_stack_fffffffffffffe08 = *(double *)(in_RDI + 0x28);
    PointT<int>::PointT<double>(&local_110,(PointT<double> *)(in_RDI + 8));
    p_00.y = in_stack_fffffffffffffe04;
    p_00.x = in_stack_fffffffffffffe00;
    Matrix<signed_char>::set(in_stack_fffffffffffffdf8,p_00,'\0');
  }
  local_4 = 0;
  goto LAB_00276734;
}

Assistant:

bool traceCorner(PointF dir, PointF& corner)
	{
		step();
		log(p);
		corner = p;
		std::swap(d, dir);
		traceStep(-1 * dir, 2, false);
		printf("turn: %.0f x %.0f -> %.2f, %.2f\n", p.x, p.y, d.x, d.y);

		return isIn(corner) && isIn(p);
	}